

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O0

_Bool iterator_descend(Iterator *self,uint32_t goal_position)

{
  Subtree *pSVar1;
  uint uVar2;
  Subtree *pSVar3;
  bool bVar4;
  _Bool _Var5;
  uint32_t uVar6;
  TreeCursorEntry *pTVar7;
  Length LVar8;
  Length LVar9;
  undefined4 uStack_11c;
  undefined8 local_118;
  uint32_t local_110;
  uint local_cc;
  Length child_right;
  uint local_70;
  Length child_left;
  Subtree *child;
  uint32_t n;
  uint32_t i;
  uint32_t structural_child_index;
  Length position;
  TreeCursorEntry entry;
  _Bool did_descend;
  uint32_t goal_position_local;
  Iterator *self_local;
  
  if ((self->in_padding & 1U) == 0) {
    do {
      bVar4 = false;
      if ((self->cursor).stack.size <= (self->cursor).stack.size - 1) {
        __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                      ,0xca,"_Bool iterator_descend(Iterator *, uint32_t)");
      }
      pTVar7 = (self->cursor).stack.contents + ((self->cursor).stack.size - 1);
      pSVar3 = pTVar7->subtree;
      i = (pTVar7->position).bytes;
      structural_child_index = (pTVar7->position).extent.row;
      entry.position.bytes = (uint32_t)*(undefined8 *)&(pTVar7->position).extent.column;
      position.bytes = entry.position.bytes;
      n = 0;
      child._4_4_ = 0;
      uVar6 = ts_subtree_child_count(*(SubtreeHeapData **)pSVar3);
      for (; child._4_4_ < uVar6; child._4_4_ = child._4_4_ + 1) {
        pSVar1 = (pSVar3->ptr->field_17).field_0.children + child._4_4_;
        LVar8 = ts_subtree_padding(*pSVar1);
        LVar9.extent.column = position.bytes;
        LVar9.bytes = i;
        LVar9.extent.row = structural_child_index;
        LVar9 = length_add(LVar9,LVar8);
        LVar8 = ts_subtree_size(*pSVar1);
        LVar8 = length_add(LVar9,LVar8);
        local_118 = LVar8._0_8_;
        local_110 = LVar8.extent.column;
        local_cc = LVar8.bytes;
        if (goal_position < local_cc) {
          array__grow((VoidArray *)&(self->cursor).stack,0x20);
          pTVar7 = (self->cursor).stack.contents;
          uVar2 = (self->cursor).stack.size;
          (self->cursor).stack.size = uVar2 + 1;
          pTVar7 = pTVar7 + uVar2;
          pTVar7->subtree = pSVar1;
          (pTVar7->position).bytes = i;
          (pTVar7->position).extent.row = structural_child_index;
          *(ulong *)&(pTVar7->position).extent.column = CONCAT44(child._4_4_,position.bytes);
          *(ulong *)&pTVar7->structural_child_index = CONCAT44(uStack_11c,n);
          _Var5 = iterator_tree_is_visible(self);
          if (_Var5) {
            local_70 = LVar9.bytes;
            if (goal_position < local_70) {
              self->in_padding = true;
            }
            else {
              self->visible_depth = self->visible_depth + 1;
            }
            return true;
          }
          bVar4 = true;
          break;
        }
        _i = local_118;
        position.bytes = local_110;
        _Var5 = ts_subtree_extra(*pSVar1);
        if (!_Var5) {
          n = n + 1;
        }
      }
    } while (bVar4);
  }
  return false;
}

Assistant:

static bool iterator_descend(Iterator *self, uint32_t goal_position) {
  if (self->in_padding) return false;

  bool did_descend;
  do {
    did_descend = false;
    TreeCursorEntry entry = *array_back(&self->cursor.stack);
    Length position = entry.position;
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0, n = ts_subtree_child_count(*entry.subtree); i < n; i++) {
      const Subtree *child = &entry.subtree->ptr->children[i];
      Length child_left = length_add(position, ts_subtree_padding(*child));
      Length child_right = length_add(child_left, ts_subtree_size(*child));

      if (child_right.bytes > goal_position) {
        array_push(&self->cursor.stack, ((TreeCursorEntry){
          .subtree = child,
          .position = position,
          .child_index = i,
          .structural_child_index = structural_child_index,
        }));

        if (iterator_tree_is_visible(self)) {
          if (child_left.bytes > goal_position) {
            self->in_padding = true;
          } else {
            self->visible_depth++;
          }
          return true;
        }

        did_descend = true;
        break;
      }

      position = child_right;
      if (!ts_subtree_extra(*child)) structural_child_index++;
    }
  } while (did_descend);

  return false;
}